

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void testNoCanRep(char *data,DataType datatype,Status expStatus)

{
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  Status ret_Status;
  StrX local_38;
  
  ret_Status = st_Init;
  StrX::StrX(&local_38,data);
  pvVar1 = (void *)xercesc_4_0::XSValue::getCanonicalRepresentation
                             (local_38.fUnicodeForm,datatype,&ret_Status,ver_10,true,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_38);
  if (pvVar1 == (void *)0x0) {
    if (ret_Status == expStatus) {
      return;
    }
    pcVar2 = getStatusString(ret_Status);
    pcVar3 = getStatusString(expStatus);
    printf("testNoCanRep fails, data=<%s> retStatus=<%s> expStatus=<%s>\n",data,pcVar2,pcVar3);
  }
  else {
    printf("testNoCanRep fails, data=<%s>\n",data);
    operator_delete(pvVar1,2);
  }
  errSeen = 1;
  return;
}

Assistant:

void  testNoCanRep(const char*                  const  data
                 , const XSValue::DataType             datatype
                 , const XSValue::Status               expStatus)
{
    XSValue::Status ret_Status = XSValue::st_Init;
    XMLCh* canRep = XSValue::getCanonicalRepresentation(StrX(data).unicodeForm(), datatype, ret_Status);

    if (canRep)
    {
        printf("testNoCanRep fails, data=<%s>\n", data);
        delete canRep;
        errSeen=true;
        return;
    }

    if (ret_Status != expStatus)
    {
        printf("testNoCanRep fails, data=<%s> retStatus=<%s> expStatus=<%s>\n",
                data
              , getStatusString(ret_Status)
              , getStatusString(expStatus));
        errSeen=true;
    }
}